

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config,string *lang,
          string *flags)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmLocalGenerator *this_00;
  string local_50;
  
  pcVar1 = this->Makefile;
  AddLanguageFlags(this,flags,target,lang,config);
  AddArchitectureFlags(this,flags,target,lang,config);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    (*this->_vptr_cmLocalGenerator[0xd])(&local_50,this,target,config);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  AddCMP0018Flags(this,flags,target,lang,config);
  AddVisibilityPresetFlags(this,flags,target,lang);
  std::__cxx11::string::string((string *)&local_50,(string *)&pcVar1->DefineFlags);
  this_00 = (cmLocalGenerator *)flags;
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GetFrameworkFlags(&local_50,this_00,lang,config,target);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  AddCompileOptions(this,flags,target,lang,config);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetCompileFlags(cmGeneratorTarget* target,
                                             std::string const& config,
                                             std::string const& lang,
                                             std::string& flags)
{
  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(flags, target, lang, config);

  this->AddArchitectureFlags(flags, target, lang, config);

  if (lang == "Fortran") {
    this->AppendFlags(flags, this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(flags, target, lang, config);
  this->AddVisibilityPresetFlags(flags, target, lang);
  this->AppendFlags(flags, mf->GetDefineFlags());
  this->AppendFlags(flags, this->GetFrameworkFlags(lang, config, target));
  this->AddCompileOptions(flags, target, lang, config);
}